

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_promise_resolve(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  undefined4 in_register_0000000c;
  JSValue func_obj;
  JSValue v;
  JSValue v_00;
  JSValue JVar5;
  JSValue v_01;
  JSValue JVar6;
  JSValue resolving_funcs [2];
  ulong local_70;
  JSValueUnion local_58;
  int64_t local_50;
  JSValueUnion local_48;
  int64_t local_40;
  JSValueUnion JVar4;
  
  if ((int)this_val.tag == -1) {
    if (magic == 0) {
      local_58 = (JSValueUnion)(argv->u).ptr;
      if ((((int)argv->tag == -1) && (*(short *)((long)local_58.ptr + 6) == 0x2a)) &&
         (*(long *)((long)local_58.ptr + 0x30) != 0)) {
        JVar5 = JS_GetPropertyInternal(ctx,*argv,0x3c,*argv,0);
        JVar4 = JVar5.u;
        if ((uint)JVar5.tag == 6) {
          bVar2 = false;
        }
        else {
          uVar3 = js_same_value(ctx,JVar5,this_val);
          local_58 = JVar4;
          if ((0xfffffff4 < (uint)JVar5.tag) &&
             (iVar1 = *JVar4.ptr, *(int *)JVar4.ptr = iVar1 + -1, iVar1 < 2)) {
            JVar4._4_4_ = 0;
            JVar4.int32 = uVar3;
            __JS_FreeValueRT(ctx->rt,JVar5);
          }
          JVar5.tag = JVar5.tag;
          JVar5.u.ptr = JVar4.ptr;
          if (uVar3 == 0) {
            bVar2 = true;
          }
          else {
            local_58 = (JSValueUnion)(argv->u).ptr;
            JVar5 = *argv;
            if (0xfffffff4 < (uint)argv->tag) {
              *(int *)local_58.ptr = *local_58.ptr + 1;
            }
            bVar2 = false;
          }
        }
        if (!bVar2) {
          return JVar5;
        }
      }
    }
    v_01 = js_new_promise_capability(ctx,(JSValue *)&local_58,this_val);
    JVar5 = v_01;
    if ((uint)v_01.tag != 6) {
      JVar6.tag = 3;
      JVar6.u.ptr = (void *)(local_70 & 0xffffffff00000000);
      func_obj.tag = (&local_50)[(long)magic * 2];
      func_obj.u.ptr = (&local_58)[(long)magic * 2].ptr;
      JVar6 = JS_CallInternal(ctx,func_obj,(JSValue)(ZEXT816(3) << 0x40),JVar6,1,argv,2);
      if ((0xfffffff4 < (uint)local_50) &&
         (iVar1 = *local_58.ptr, *(int *)local_58.ptr = iVar1 + -1, iVar1 < 2)) {
        v.tag = local_50;
        v.u.ptr = local_58.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
      if ((0xfffffff4 < (uint)local_40) &&
         (iVar1 = *local_48.ptr, *(int *)local_48.ptr = iVar1 + -1, iVar1 < 2)) {
        v_00.tag = local_40;
        v_00.u.ptr = local_48.ptr;
        __JS_FreeValueRT(ctx->rt,v_00);
      }
      if ((uint)JVar6.tag == 6) {
        JVar5 = JVar6;
        if ((0xfffffff4 < (uint)v_01.tag) &&
           (iVar1 = *v_01.u.ptr, *(int *)v_01.u.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(ctx->rt,v_01);
        }
      }
      else if ((0xfffffff4 < (uint)JVar6.tag) &&
              (iVar1 = *JVar6.u.ptr, *(int *)JVar6.u.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar6);
      }
    }
  }
  else {
    JS_ThrowTypeError(ctx,"not an object",this_val.tag,CONCAT44(in_register_0000000c,argc));
    JVar5 = (JSValue)(ZEXT816(6) << 0x40);
  }
  return JVar5;
}

Assistant:

static JSValue js_promise_resolve(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv, int magic)
{
    JSValue result_promise, resolving_funcs[2], ret;
    BOOL is_reject = magic;

    if (!JS_IsObject(this_val))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    if (!is_reject && JS_GetOpaque(argv[0], JS_CLASS_PROMISE)) {
        JSValue ctor;
        BOOL is_same;
        ctor = JS_GetProperty(ctx, argv[0], JS_ATOM_constructor);
        if (JS_IsException(ctor))
            return ctor;
        is_same = js_same_value(ctx, ctor, this_val);
        JS_FreeValue(ctx, ctor);
        if (is_same)
            return JS_DupValue(ctx, argv[0]);
    }
    result_promise = js_new_promise_capability(ctx, resolving_funcs, this_val);
    if (JS_IsException(result_promise))
        return result_promise;
    ret = JS_Call(ctx, resolving_funcs[is_reject], JS_UNDEFINED, 1, argv);
    JS_FreeValue(ctx, resolving_funcs[0]);
    JS_FreeValue(ctx, resolving_funcs[1]);
    if (JS_IsException(ret)) {
        JS_FreeValue(ctx, result_promise);
        return ret;
    }
    JS_FreeValue(ctx, ret);
    return result_promise;
}